

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalGet
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          LocalGet *curr)

{
  Name breakTo;
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Literals>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Literals>,_false> local_28;
  iterator iter;
  LocalGet *curr_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Literals>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Literals>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Literals>,_false>)curr;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
       ::find(&this->localValues,&curr->index);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
       ::end(&this->localValues);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_wasm::Literals>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_wasm::Literals>,_false,_false>
                         *)&local_28);
    Flow::Flow(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    breakTo.super_IString.str._M_str = DAT_03194068;
    breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitLocalGet(LocalGet* curr) {
    NOTE_ENTER("LocalGet");
    NOTE_EVAL1(curr->index);
    // Check if a constant value has been set in the context of this runner.
    auto iter = localValues.find(curr->index);
    if (iter != localValues.end()) {
      return Flow(iter->second);
    }
    return Flow(NONCONSTANT_FLOW);
  }